

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O1

void __thiscall
CP::priority_queue<int,_bool_(*)(const_int_&,_const_int_&)>::fixDown
          (priority_queue<int,_bool_(*)(const_int_&,_const_int_&)> *this,size_t idx)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int tmp;
  int local_34;
  long lVar7;
  
  iVar1 = this->mData[idx];
  uVar5 = idx * 2 + 1;
  uVar3 = this->mSize;
  if (uVar5 < uVar3) {
    lVar7 = idx * 2;
    do {
      uVar6 = lVar7 + 2;
      uVar4 = uVar5;
      if ((uVar6 < uVar3) &&
         (bVar2 = (*this->mLess)(this->mData + uVar5,this->mData + uVar6), uVar4 = uVar6, !bVar2)) {
        uVar4 = uVar5;
      }
      bVar2 = (*this->mLess)(this->mData + uVar4,&local_34);
      if (bVar2) break;
      this->mData[idx] = this->mData[uVar4];
      lVar7 = uVar4 * 2;
      uVar5 = uVar4 * 2 + 1;
      uVar3 = this->mSize;
      idx = uVar4;
    } while (uVar5 < uVar3);
  }
  this->mData[idx] = iVar1;
  return;
}

Assistant:

void fixDown(size_t idx) {
      T tmp = mData[idx];
      size_t c;
      while ((c = 2 * idx + 1) < mSize) {
        if (c + 1 < mSize && mLess(mData[c],mData[c + 1]) ) c++;
        if ( mLess(mData[c],tmp) ) break;
        mData[idx] = mData[c];
        idx = c;
      }
      mData[idx] = tmp;
    }